

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O0

void WriteTableIntoFile(FILE *pFile)

{
  int iVar1;
  varvalue vVar2;
  int Value;
  int WordSize;
  int nOutput;
  int cOutputs;
  Cube *p;
  int w;
  int v;
  FILE *pFile_local;
  
  _nOutput = IterCubeSetStart();
  do {
    if (_nOutput == (Cube *)0x0) {
      return;
    }
    if (_nOutput->fMark != '\0') {
      __assert_fail("p->fMark == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorUtil.c"
                    ,0x92,"void WriteTableIntoFile(FILE *)");
    }
    for (p._4_4_ = 0; p._4_4_ < g_CoverInfo.nVarsIn; p._4_4_ = p._4_4_ + 1) {
      vVar2 = GetVar(_nOutput,p._4_4_);
      if (vVar2 == VAR_NEG) {
        fprintf((FILE *)pFile,"0");
      }
      else if (vVar2 == VAR_POS) {
        fprintf((FILE *)pFile,"1");
      }
      else {
        if (vVar2 != VAR_ABS) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorUtil.c"
                        ,0x9f,"void WriteTableIntoFile(FILE *)");
        }
        fprintf((FILE *)pFile,"-");
      }
    }
    fprintf((FILE *)pFile," ");
    iVar1 = g_CoverInfo.nVarsOut;
    WordSize = 0;
    for (p._0_4_ = 0; (int)p < g_CoverInfo.nWordsOut; p._0_4_ = (int)p + 1) {
      for (p._4_4_ = 0; p._4_4_ < 0x20; p._4_4_ = p._4_4_ + 1) {
        if ((_nOutput->pCubeDataOut[(int)p] & 1 << ((byte)p._4_4_ & 0x1f)) == 0) {
          fprintf((FILE *)pFile,"0");
        }
        else {
          fprintf((FILE *)pFile,"1");
        }
        WordSize = WordSize + 1;
        if (WordSize == iVar1) break;
      }
    }
    fprintf((FILE *)pFile,"\n");
    _nOutput = IterCubeSetNext();
  } while( true );
}

Assistant:

void WriteTableIntoFile( FILE * pFile )
// nCubesAlloc is the number of allocated cubes 
{
    int v, w;
    Cube * p;
    int cOutputs;
    int nOutput;
    int WordSize;

    for ( p = IterCubeSetStart( ); p; p = IterCubeSetNext() )
    {
        assert( p->fMark == 0 );

        // write the input variables
        for ( v = 0; v < g_CoverInfo.nVarsIn; v++ )
        {
            int Value = GetVar( p, v );
            if ( Value == VAR_NEG )
                fprintf( pFile, "0" );
            else if ( Value == VAR_POS )
                fprintf( pFile, "1" );
            else if ( Value == VAR_ABS )
                fprintf( pFile, "-" );
            else
                assert(0);
        }
        fprintf( pFile, " " );

        // write the output variables
        cOutputs = 0;
        nOutput = g_CoverInfo.nVarsOut;
        WordSize = 8*sizeof( unsigned );
        for ( w = 0; w < g_CoverInfo.nWordsOut; w++ )
            for ( v = 0; v < WordSize; v++ )
            {
                if ( p->pCubeDataOut[w] & (1<<v) )
                    fprintf( pFile, "1" );
                else
                    fprintf( pFile, "0" );
                if ( ++cOutputs == nOutput )
                    break;
            }
        fprintf( pFile, "\n" );
    }
}